

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void check_and_resend(longlong current_time)

{
  pointer piVar1;
  pointer ppVar2;
  _Base_ptr p_Var3;
  mapped_type_conflict *pmVar4;
  _Rb_tree_node_base *p_Var5;
  vector<int,_std::allocator<int>_> *__range2;
  pointer ppVar6;
  value_type vVar7;
  pair<const_std::pair<int,_int>,_long_long> elem;
  pair<const_int,_long_long> msg;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> outdates_messages;
  _Vector_base<int,_std::allocator<int>_> local_88;
  undefined8 local_68;
  _Base_ptr p_Stack_60;
  _Base_ptr local_50;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var3 = MT._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ppVar2 = local_48._M_impl.super__Vector_impl_data._M_finish,
      ppVar6 = local_48._M_impl.super__Vector_impl_data._M_start,
      (_Rb_tree_header *)p_Var3 != &MT._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_88._M_impl.super__Vector_impl_data._M_start._0_4_ = p_Var3[1]._M_color;
    local_88._M_impl.super__Vector_impl_data._M_start._4_4_ = *(int *)&p_Var3[1].field_0x4;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var3[1]._M_parent;
    if (5000000 < current_time - (long)local_88._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_48,
                 (value_type *)&local_88);
    }
  }
  for (; p_Var5 = MM._M_t._M_impl.super__Rb_tree_header._M_header._M_left, ppVar6 != ppVar2;
      ppVar6 = ppVar6 + 1) {
    erase_message_from_maps((pair<int,_int>)0x102b18);
  }
  for (; (_Rb_tree_header *)p_Var5 != &MM._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var5[1]._M_left;
    local_88._M_impl.super__Vector_impl_data._M_start._0_4_ = p_Var5[1]._M_color;
    local_88._M_impl.super__Vector_impl_data._M_start._4_4_ = *(int *)&p_Var5[1].field_0x4;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var5[1]._M_parent;
    pmVar4 = std::
             map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
             ::operator[](&MST,(key_type *)&local_88);
    if (1000000 < current_time - *pmVar4) {
      send_message((int)local_88._M_impl.super__Vector_impl_data._M_start,
                   local_88._M_impl.super__Vector_impl_data._M_start._4_4_);
      pmVar4 = std::
               map<std::pair<int,_int>,_long_long,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_long_long>_>_>
               ::operator[](&MST,(key_type *)&local_88);
      *pmVar4 = current_time;
    }
  }
  p_Var3 = received_messages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &received_messages._M_t._M_impl.super__Rb_tree_header) {
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_50 = p_Var3;
    for (p_Var5 = *(_Rb_tree_node_base **)(p_Var3 + 2);
        piVar1 = local_88._M_impl.super__Vector_impl_data._M_finish,
        vVar7 = (value_type)local_88._M_impl.super__Vector_impl_data._M_start,
        p_Var5 != (_Rb_tree_node_base *)&p_Var3[1]._M_left;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      local_68 = *(undefined8 *)(p_Var5 + 1);
      p_Stack_60 = p_Var5[1]._M_parent;
      if (5000000 < current_time - (long)p_Stack_60) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_88,(value_type_conflict1 *)&local_68)
        ;
      }
    }
    for (; vVar7 != (value_type)piVar1; vVar7 = (value_type)((long)vVar7 + 4)) {
      local_68 = CONCAT44(local_68._4_4_,*(undefined4 *)vVar7);
      std::
      _Rb_tree<int,_std::pair<const_int,_long_long>,_std::_Select1st<std::pair<const_int,_long_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
      ::erase((_Rb_tree<int,_std::pair<const_int,_long_long>,_std::_Select1st<std::pair<const_int,_long_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
               *)&p_Var3[1]._M_parent,(key_type *)&local_68);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(local_50);
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_48);
  return;
}

Assistant:

void check_and_resend(long long current_time) {
    std::vector<std::pair<int, int>> outdates_messages;
    for (auto elem : MT) {
        long long diff = current_time - elem.second;
        if (diff > TIME_TO_KEEP) {
            outdates_messages.push_back(elem.first);
        }
    }

    for (auto key : outdates_messages) {
        erase_message_from_maps(key);
    }

    for (auto elem : MM) {
        long long diff = current_time - MST[elem.first];
        if (diff > SENDING_INTERVAL) {
            int id_destination = elem.first.first;
            int id_message = elem.first.second;
            send_message(id_destination, id_message);
            MST[elem.first] = current_time;
        }
    }

    for (auto it = received_messages.begin(); it != received_messages.end(); ++it) {
        std::vector<int> outdates_received_kept;
        for (auto msg : it->second) {
            long long diff = current_time - msg.second;
            if (diff > TIME_KEEP_RECEIVED) {
                outdates_received_kept.push_back(msg.first);
            }
        }
        for (auto id : outdates_received_kept) {
            it->second.erase(id);
        }
    }
}